

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  string *psVar1;
  string *psVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
  local_60.first._M_str = (psVar1->_M_dataplus)._M_p;
  local_60.first._M_len = psVar1->_M_string_length;
  local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = 0xc;
  local_40 = "/CMakeFiles/";
  local_38 = 0;
  local_28 = (psVar2->_M_dataplus)._M_p;
  local_30 = psVar2->_M_string_length;
  local_20 = 0;
  views._M_len = 3;
  views._M_array = &local_60;
  cmCatViews(__return_storage_ptr__,views);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                             "/CMakeFiles/", this->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}